

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O3

void __thiscall BitmapIndexBuilder::BitmapIndexBuilder(BitmapIndexBuilder *this,IndexType ntype)

{
  value_type_conflict1 *__val;
  pointer __s;
  
  (this->super_IndexBuilder).ntype = ntype;
  (this->super_IndexBuilder)._vptr_IndexBuilder = (_func_int **)&PTR__BitmapIndexBuilder_001ecb10;
  (this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x1000000);
  (this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x1000000;
  memset(__s,0,0x1000000);
  (this->raw_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x1000000;
  return;
}

Assistant:

BitmapIndexBuilder::BitmapIndexBuilder(IndexType ntype)
    : IndexBuilder(ntype), raw_data(file_run_size * NUM_TRIGRAMS) {}